

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::binary::swap_bytes<signed_char>(binary *this,Read<signed_char> *array,bool needs_swapping)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  Read<signed_char> RVar2;
  Write<signed_char> local_b0;
  undefined1 local_a0 [8];
  type f;
  allocator local_79;
  string local_78 [32];
  Read<signed_char> local_58;
  undefined1 local_48 [8];
  Write<signed_char> out;
  bool needs_swapping_local;
  Read<signed_char> *array_local;
  LO local_10;
  
  out.shared_alloc_.direct_ptr._7_1_ = needs_swapping;
  if (needs_swapping) {
    Read<signed_char>::Read(&local_58,array);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"",&local_79);
    deep_copy<signed_char>((Omega_h *)local_48,&local_58,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    Read<signed_char>::~Read(&local_58);
    Write<signed_char>::Write((Write<signed_char> *)local_a0,(Write<signed_char> *)local_48);
    if (((ulong)local_48 & 1) == 0) {
      local_10 = (LO)*(size_t *)local_48;
    }
    else {
      local_10 = (LO)((ulong)local_48 >> 3);
    }
    parallel_for<Omega_h::binary::swap_bytes<signed_char>(Omega_h::Read<signed_char>,bool)::_lambda(int)_1_>
              (local_10,(type *)local_a0,"swap_if_needed");
    Write<signed_char>::Write(&local_b0,(Write<signed_char> *)local_48);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_b0);
    Write<signed_char>::~Write(&local_b0);
    swap_bytes<signed_char>(Omega_h::Read<signed_char>,bool)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)local_a0);
    Write<signed_char>::~Write((Write<signed_char> *)local_48);
    pvVar1 = extraout_RDX_00;
  }
  else {
    Read<signed_char>::Read((Read<signed_char> *)this,array);
    pvVar1 = extraout_RDX;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<T> swap_bytes(Read<T> array, bool needs_swapping) {
  if (!needs_swapping) return array;
  Write<T> out = deep_copy(array);
  auto f = OMEGA_H_LAMBDA(LO i) { SwapBytes<T>::swap(&out[i]); };
  parallel_for(out.size(), f, "swap_if_needed");
  return out;
}